

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void highbd_dr_prediction_z1_64xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx)

{
  long lVar1;
  uint16_t uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ushort uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar14 [32];
  
  uVar7 = (ulong)(uint)upsample_above;
  lVar1 = (long)N + 0x3f;
  uVar2 = above[(long)N + 0x3f];
  auVar13._2_2_ = uVar2;
  auVar13._0_2_ = uVar2;
  auVar13._4_2_ = uVar2;
  auVar13._6_2_ = uVar2;
  auVar13._8_2_ = uVar2;
  auVar13._10_2_ = uVar2;
  auVar13._12_2_ = uVar2;
  auVar13._14_2_ = uVar2;
  auVar14._16_2_ = uVar2;
  auVar14._0_16_ = auVar13;
  auVar14._18_2_ = uVar2;
  auVar14._20_2_ = uVar2;
  auVar14._22_2_ = uVar2;
  auVar14._24_2_ = uVar2;
  auVar14._26_2_ = uVar2;
  auVar14._28_2_ = uVar2;
  auVar14._30_2_ = uVar2;
  auVar15._0_2_ = (undefined2)(N + 0x3f);
  auVar15._2_2_ = auVar15._0_2_;
  auVar15._4_2_ = auVar15._0_2_;
  auVar15._6_2_ = auVar15._0_2_;
  auVar15._8_2_ = auVar15._0_2_;
  auVar15._10_2_ = auVar15._0_2_;
  auVar15._12_2_ = auVar15._0_2_;
  auVar15._14_2_ = auVar15._0_2_;
  auVar15._16_2_ = auVar15._0_2_;
  auVar15._18_2_ = auVar15._0_2_;
  auVar15._20_2_ = auVar15._0_2_;
  auVar15._22_2_ = auVar15._0_2_;
  auVar15._24_2_ = auVar15._0_2_;
  auVar15._26_2_ = auVar15._0_2_;
  auVar15._28_2_ = auVar15._0_2_;
  auVar15._30_2_ = auVar15._0_2_;
  iVar10 = 0;
  iVar9 = 0;
  if (0 < N) {
    iVar9 = N;
  }
  auVar16._8_2_ = 0x10;
  auVar16._0_8_ = 0x10001000100010;
  auVar16._10_2_ = 0x10;
  auVar16._12_2_ = 0x10;
  auVar16._14_2_ = 0x10;
  auVar16._16_2_ = 0x10;
  auVar16._18_2_ = 0x10;
  auVar16._20_2_ = 0x10;
  auVar16._22_2_ = 0x10;
  auVar16._24_2_ = 0x10;
  auVar16._26_2_ = 0x10;
  auVar16._28_2_ = 0x10;
  auVar16._30_2_ = 0x10;
  auVar3 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
  while( true ) {
    if (iVar10 == iVar9) {
      return;
    }
    iVar8 = (int)uVar7 >> 6;
    iVar6 = (int)lVar1;
    iVar4 = N;
    if (iVar8 < iVar6) {
      uVar5 = (ushort)(uVar7 >> 1);
      uVar17 = uVar5 & 0x1f;
      auVar18._0_8_ = CONCAT26(uVar5,CONCAT24(uVar5,CONCAT22(uVar5,uVar5))) & 0x1f001f001f001f;
      auVar18._8_2_ = uVar17;
      auVar18._10_2_ = uVar17;
      auVar18._12_2_ = uVar17;
      auVar18._14_2_ = uVar17;
      auVar18._16_2_ = uVar17;
      auVar18._18_2_ = uVar17;
      auVar18._20_2_ = uVar17;
      auVar18._22_2_ = uVar17;
      auVar18._24_2_ = uVar17;
      auVar18._26_2_ = uVar17;
      auVar18._28_2_ = uVar17;
      auVar18._30_2_ = uVar17;
      lVar12 = (long)iVar8;
      for (uVar11 = 0; uVar11 < 0x40; uVar11 = uVar11 + 0x10) {
        auVar19 = auVar14;
        if ((long)(lVar12 + uVar11) < lVar1) {
          auVar19 = vpsubw_avx2(*(undefined1 (*) [32])(above + lVar12 + uVar11 + 1),
                                *(undefined1 (*) [32])(above + lVar12 + uVar11));
          auVar20 = vpmullw_avx2(auVar19,auVar18);
          auVar19 = vpsllw_avx2(*(undefined1 (*) [32])(above + lVar12 + uVar11),5);
          auVar19 = vpaddw_avx2(auVar19,auVar16);
          auVar19 = vpaddw_avx2(auVar20,auVar19);
          auVar20 = vpsrlw_avx2(auVar19,5);
          iVar4 = (int)uVar11;
          auVar21._0_2_ = (undefined2)(iVar8 + iVar4);
          auVar21._2_2_ = auVar21._0_2_;
          auVar21._4_2_ = auVar21._0_2_;
          auVar21._6_2_ = auVar21._0_2_;
          auVar21._8_2_ = auVar21._0_2_;
          auVar21._10_2_ = auVar21._0_2_;
          auVar21._12_2_ = auVar21._0_2_;
          auVar21._14_2_ = auVar21._0_2_;
          auVar21 = vpaddw_avx(auVar21,auVar3);
          auVar22 = vpslldq_avx(auVar21,2);
          auVar22 = vpblendw_avx(auVar22,ZEXT416((uint)(iVar8 + iVar4)),1);
          auVar21 = vpsrldq_avx(auVar21,0xe);
          auVar19._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar13;
          auVar19._16_16_ = ZEXT116(0) * auVar14._16_16_ + ZEXT116(1) * auVar21;
          auVar23._0_2_ = (undefined2)(iVar8 + 9 + iVar4);
          auVar23._2_2_ = auVar23._0_2_;
          auVar23._4_2_ = auVar23._0_2_;
          auVar23._6_2_ = auVar23._0_2_;
          auVar23._8_2_ = auVar23._0_2_;
          auVar23._10_2_ = auVar23._0_2_;
          auVar23._12_2_ = auVar23._0_2_;
          auVar23._14_2_ = auVar23._0_2_;
          auVar23._16_2_ = auVar23._0_2_;
          auVar23._18_2_ = auVar23._0_2_;
          auVar23._20_2_ = auVar23._0_2_;
          auVar23._22_2_ = auVar23._0_2_;
          auVar23._24_2_ = auVar23._0_2_;
          auVar23._26_2_ = auVar23._0_2_;
          auVar23._28_2_ = auVar23._0_2_;
          auVar23._30_2_ = auVar23._0_2_;
          auVar19 = vpblendw_avx2(auVar19,auVar23,2);
          auVar24._0_2_ = (undefined2)(iVar8 + 10 + iVar4);
          auVar24._2_2_ = auVar24._0_2_;
          auVar24._4_2_ = auVar24._0_2_;
          auVar24._6_2_ = auVar24._0_2_;
          auVar24._8_2_ = auVar24._0_2_;
          auVar24._10_2_ = auVar24._0_2_;
          auVar24._12_2_ = auVar24._0_2_;
          auVar24._14_2_ = auVar24._0_2_;
          auVar24._16_2_ = auVar24._0_2_;
          auVar24._18_2_ = auVar24._0_2_;
          auVar24._20_2_ = auVar24._0_2_;
          auVar24._22_2_ = auVar24._0_2_;
          auVar24._24_2_ = auVar24._0_2_;
          auVar24._26_2_ = auVar24._0_2_;
          auVar24._28_2_ = auVar24._0_2_;
          auVar24._30_2_ = auVar24._0_2_;
          auVar19 = vpblendw_avx2(auVar19,auVar24,4);
          auVar25._0_2_ = (undefined2)(iVar8 + 0xb + iVar4);
          auVar25._2_2_ = auVar25._0_2_;
          auVar25._4_2_ = auVar25._0_2_;
          auVar25._6_2_ = auVar25._0_2_;
          auVar25._8_2_ = auVar25._0_2_;
          auVar25._10_2_ = auVar25._0_2_;
          auVar25._12_2_ = auVar25._0_2_;
          auVar25._14_2_ = auVar25._0_2_;
          auVar25._16_2_ = auVar25._0_2_;
          auVar25._18_2_ = auVar25._0_2_;
          auVar25._20_2_ = auVar25._0_2_;
          auVar25._22_2_ = auVar25._0_2_;
          auVar25._24_2_ = auVar25._0_2_;
          auVar25._26_2_ = auVar25._0_2_;
          auVar25._28_2_ = auVar25._0_2_;
          auVar25._30_2_ = auVar25._0_2_;
          auVar19 = vpblendw_avx2(auVar19,auVar25,8);
          auVar26._0_2_ = (undefined2)(iVar8 + 0xc + iVar4);
          auVar26._2_2_ = auVar26._0_2_;
          auVar26._4_2_ = auVar26._0_2_;
          auVar26._6_2_ = auVar26._0_2_;
          auVar26._8_2_ = auVar26._0_2_;
          auVar26._10_2_ = auVar26._0_2_;
          auVar26._12_2_ = auVar26._0_2_;
          auVar26._14_2_ = auVar26._0_2_;
          auVar26._16_2_ = auVar26._0_2_;
          auVar26._18_2_ = auVar26._0_2_;
          auVar26._20_2_ = auVar26._0_2_;
          auVar26._22_2_ = auVar26._0_2_;
          auVar26._24_2_ = auVar26._0_2_;
          auVar26._26_2_ = auVar26._0_2_;
          auVar26._28_2_ = auVar26._0_2_;
          auVar26._30_2_ = auVar26._0_2_;
          auVar19 = vpblendw_avx2(auVar19,auVar26,0x10);
          auVar27._0_2_ = (undefined2)(iVar8 + 0xd + iVar4);
          auVar27._2_2_ = auVar27._0_2_;
          auVar27._4_2_ = auVar27._0_2_;
          auVar27._6_2_ = auVar27._0_2_;
          auVar27._8_2_ = auVar27._0_2_;
          auVar27._10_2_ = auVar27._0_2_;
          auVar27._12_2_ = auVar27._0_2_;
          auVar27._14_2_ = auVar27._0_2_;
          auVar27._16_2_ = auVar27._0_2_;
          auVar27._18_2_ = auVar27._0_2_;
          auVar27._20_2_ = auVar27._0_2_;
          auVar27._22_2_ = auVar27._0_2_;
          auVar27._24_2_ = auVar27._0_2_;
          auVar27._26_2_ = auVar27._0_2_;
          auVar27._28_2_ = auVar27._0_2_;
          auVar27._30_2_ = auVar27._0_2_;
          auVar19 = vpblendw_avx2(auVar19,auVar27,0x20);
          auVar28._0_2_ = (undefined2)(iVar8 + 0xe + iVar4);
          auVar28._2_2_ = auVar28._0_2_;
          auVar28._4_2_ = auVar28._0_2_;
          auVar28._6_2_ = auVar28._0_2_;
          auVar28._8_2_ = auVar28._0_2_;
          auVar28._10_2_ = auVar28._0_2_;
          auVar28._12_2_ = auVar28._0_2_;
          auVar28._14_2_ = auVar28._0_2_;
          auVar28._16_2_ = auVar28._0_2_;
          auVar28._18_2_ = auVar28._0_2_;
          auVar28._20_2_ = auVar28._0_2_;
          auVar28._22_2_ = auVar28._0_2_;
          auVar28._24_2_ = auVar28._0_2_;
          auVar28._26_2_ = auVar28._0_2_;
          auVar28._28_2_ = auVar28._0_2_;
          auVar28._30_2_ = auVar28._0_2_;
          auVar19 = vpblendw_avx2(auVar19,auVar28,0x40);
          auVar29._0_2_ = (undefined2)(iVar8 + 0xf + iVar4);
          auVar29._2_2_ = auVar29._0_2_;
          auVar29._4_2_ = auVar29._0_2_;
          auVar29._6_2_ = auVar29._0_2_;
          auVar29._8_2_ = auVar29._0_2_;
          auVar29._10_2_ = auVar29._0_2_;
          auVar29._12_2_ = auVar29._0_2_;
          auVar29._14_2_ = auVar29._0_2_;
          auVar29._16_2_ = auVar29._0_2_;
          auVar29._18_2_ = auVar29._0_2_;
          auVar29._20_2_ = auVar29._0_2_;
          auVar29._22_2_ = auVar29._0_2_;
          auVar29._24_2_ = auVar29._0_2_;
          auVar29._26_2_ = auVar29._0_2_;
          auVar29._28_2_ = auVar29._0_2_;
          auVar29._30_2_ = auVar29._0_2_;
          auVar19 = vpblendw_avx2(auVar19,auVar29,0x80);
          auVar19 = vpblendd_avx2(ZEXT1632(auVar22),auVar19,0xf0);
          auVar19 = vpcmpgtw_avx2(auVar15,auVar19);
          auVar19 = vpblendvb_avx2(auVar14,auVar20,auVar19);
        }
        *(undefined1 (*) [32])((long)*(undefined1 (*) [32])dst + uVar11 * 2) = auVar19;
      }
      uVar7 = (ulong)(uint)((int)uVar7 + upsample_above);
    }
    else {
      while (iVar4 != 0) {
        *(undefined1 (*) [32])dst = auVar14;
        *(undefined1 (*) [32])((long)dst + 0x20) = auVar14;
        *(undefined1 (*) [32])((long)dst + 0x40) = auVar14;
        *(undefined1 (*) [32])((long)dst + 0x60) = auVar14;
        dst = (uint16_t *)((long)*(undefined1 (*) [32])dst + stride * 2);
        iVar4 = iVar4 + -1;
      }
    }
    if (iVar6 <= iVar8) break;
    iVar10 = iVar10 + 1;
    dst = (uint16_t *)((long)*(undefined1 (*) [32])dst + stride * 2);
    N = N + -1;
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z1_64xN_avx2(int N, uint16_t *dst,
                                              ptrdiff_t stride,
                                              const uint16_t *above,
                                              int upsample_above, int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0, a1, a32, a16, c3f;
  __m256i a_mbase_x, diff, max_base_x256, base_inc256, mask256;

  a16 = _mm256_set1_epi16(16);
  a_mbase_x = _mm256_set1_epi16(above[max_base_x]);
  max_base_x256 = _mm256_set1_epi16(max_base_x);
  c3f = _mm256_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m256i b, res;

    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm256_storeu_si256((__m256i *)dst, a_mbase_x);  // save 32 values
        _mm256_storeu_si256((__m256i *)(dst + 16), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 32), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 48), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m256i shift =
        _mm256_srli_epi16(_mm256_and_si256(_mm256_set1_epi16(x), c3f), 1);

    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm256_storeu_si256((__m256i *)(dst + j), a_mbase_x);
      } else {
        a0 = _mm256_loadu_si256((__m256i *)(above + base + j));
        a1 = _mm256_loadu_si256((__m256i *)(above + base + 1 + j));

        diff = _mm256_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm256_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm256_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm256_mullo_epi16(diff, shift);

        res = _mm256_add_epi16(a32, b);
        res = _mm256_srli_epi16(res, 5);

        base_inc256 = _mm256_setr_epi16(
            base + j, base + j + 1, base + j + 2, base + j + 3, base + j + 4,
            base + j + 5, base + j + 6, base + j + 7, base + j + 8,
            base + j + 9, base + j + 10, base + j + 11, base + j + 12,
            base + j + 13, base + j + 14, base + j + 15);

        mask256 = _mm256_cmpgt_epi16(max_base_x256, base_inc256);
        res = _mm256_blendv_epi8(a_mbase_x, res, mask256);
        _mm256_storeu_si256((__m256i *)(dst + j), res);  // 16 16bit values
      }
    }
    x += dx;
  }
}